

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliasedOutline
          (EpsCopyOutputStream *this,uint32 num,string *s,uint8 *ptr)

{
  uint size;
  bool bVar1;
  uint uVar2;
  uint8 *puVar3;
  byte *pbVar4;
  byte *pbVar5;
  uint uVar6;
  
  if (this->end_ <= ptr) {
    ptr = EnsureSpaceFallback(this,ptr);
  }
  size = (uint)s->_M_string_length;
  uVar6 = num << 3;
  if (uVar6 < 0x80) {
    *ptr = (byte)uVar6 | 2;
    pbVar4 = ptr + 1;
  }
  else {
    *ptr = (byte)uVar6 | 0x82;
    if (uVar6 < 0x4000) {
      ptr[1] = (byte)(uVar6 >> 7);
      pbVar4 = ptr + 2;
    }
    else {
      pbVar4 = ptr + 2;
      uVar6 = uVar6 >> 7;
      do {
        pbVar5 = pbVar4;
        pbVar5[-1] = (byte)uVar6 | 0x80;
        uVar2 = uVar6 >> 7;
        pbVar4 = pbVar5 + 1;
        bVar1 = 0x3fff < uVar6;
        uVar6 = uVar2;
      } while (bVar1);
      *pbVar5 = (byte)uVar2;
    }
  }
  uVar6 = size;
  uVar2 = size;
  if (0x7f < size) {
    do {
      *pbVar4 = (byte)uVar2 | 0x80;
      pbVar4 = pbVar4 + 1;
      bVar1 = 0x3fff < uVar2;
      uVar6 = uVar2 >> 7;
      uVar2 = uVar2 >> 7;
    } while (bVar1);
  }
  *pbVar4 = (byte)uVar6;
  puVar3 = WriteRawMaybeAliased(this,(s->_M_dataplus)._M_p,size,pbVar4 + 1);
  return puVar3;
}

Assistant:

uint8* EpsCopyOutputStream::WriteStringMaybeAliasedOutline(uint32 num,
                                                           const std::string& s,
                                                           uint8* ptr) {
  EnsureSpace(&ptr);
  uint32 size = s.size();
  ptr = WriteLengthDelim(num, size, ptr);
  return WriteRawMaybeAliased(s.data(), size, ptr);
}